

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

void sshcom_derivekey(ptrlen passphrase,uint8_t *keybuf)

{
  ssh_hash *h_00;
  ssh_hash *h;
  uint8_t *keybuf_local;
  ptrlen passphrase_local;
  
  h_00 = ssh_hash_new(&ssh_md5);
  BinarySink_put_datapl(h_00->binarysink_,passphrase);
  ssh_hash_digest_nondestructive(h_00,keybuf);
  BinarySink_put_data(h_00->binarysink_,keybuf,0x10);
  ssh_hash_final(h_00,keybuf + 0x10);
  return;
}

Assistant:

static void sshcom_derivekey(ptrlen passphrase, uint8_t *keybuf)
{
    /*
     * Derive the encryption key for an ssh.com key file from the
     * passphrase and iv/salt:
     *
     *  - let block A equal MD5(passphrase)
     *  - let block B equal MD5(passphrase || A)
     *  - block C would be MD5(passphrase || A || B) and so on
     *  - encryption key is the first N bytes of A || B
     */
    ssh_hash *h;

    h = ssh_hash_new(&ssh_md5);
    put_datapl(h, passphrase);
    ssh_hash_digest_nondestructive(h, keybuf);
    put_data(h, keybuf, 16);
    ssh_hash_final(h, keybuf + 16);
}